

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

rel_iterator * __thiscall
dg::vr::ValueRelations::begin_related
          (rel_iterator *__return_storage_ptr__,ValueRelations *this,V val,Relations *rels)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var2;
  for (p_Var1 = (this->valToBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(V *)(p_Var1 + 1) < val]) {
    if (*(V *)(p_Var1 + 1) >= val) {
      p_Var3 = p_Var1;
    }
  }
  if ((p_Var3 != p_Var2) && (*(V *)(p_Var3 + 1) <= val)) {
    p_Var2 = p_Var3;
  }
  RelatedValueIterator::RelatedValueIterator
            (__return_storage_ptr__,this,(Handle)p_Var2[1]._M_parent,rels);
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::rel_iterator
ValueRelations::begin_related(V val, const Relations &rels) const {
    assert(valToBucket.find(val) != valToBucket.end());
    Handle h = valToBucket.find(val)->second;
    return {*this, h, rels};
}